

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidPooling3d(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  GRULayerParams *pGVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  Pooling3DLayerParams *pPVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar19;
  Arena *pAVar20;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018e0a1:
    pRVar18 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0018e0a1;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar17);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar2] = 10;
  uVar19 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar19;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar19] = 0xb;
  uVar19 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar19;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar19] = 0xc;
  uVar19 = uVar2 + 3;
  (pAVar9->shape_).current_size_ = uVar19;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar19] = 0xd;
  uVar19 = uVar2 + 4;
  (pAVar9->shape_).current_size_ = uVar19;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar19] = 0xe;
  this->current_size_ = uVar2 + 5;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018e265:
    pRVar18 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0018e265;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"probs",puVar17);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018e35c:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0018e35c;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0018e394:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0018e394;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar14 = pRVar4->elements[iVar1];
      goto LAB_0018e3fe;
    }
  }
  pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
LAB_0018e3fe:
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3b872d);
  if (pNVar12->_oneof_case_[0] != 0x5b9) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x5b9;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pPVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::Pooling3DLayerParams>(pAVar20);
    (pNVar12->layer_).pooling3d_ = pPVar15;
  }
  pGVar6 = (pNVar12->layer_).gru_;
  *(undefined8 *)((long)&(pGVar6->activations_).super_RepeatedPtrFieldBase.arena_ + 4) = 0x200000002
  ;
  *(undefined8 *)&(pGVar6->activations_).super_RepeatedPtrFieldBase.total_size_ = 0x500000002;
  *(undefined8 *)((long)&(pGVar6->activations_).super_RepeatedPtrFieldBase.rep_ + 4) = 0x500000005;
  *(undefined4 *)&pGVar6->resetgaterecursionmatrix_ = 0;
  *(undefined8 *)((long)&pGVar6->updategateweightmatrix_ + 4) = 0x700000007;
  *(undefined8 *)((long)&pGVar6->resetgateweightmatrix_ + 4) = 0x700000007;
  *(undefined8 *)((long)&pGVar6->outputgateweightmatrix_ + 4) = 0x700000007;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4a3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)!bVar7;
}

Assistant:

int testValidPooling3d() {
    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    // Adding 5 shapes for a rank 5 input.
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);
    shape->add_shape(13);
    shape->add_shape(14);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(CoreML::Specification::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *pooling3dLayer = nn->add_layers();
    pooling3dLayer->add_input("input");
    pooling3dLayer->add_output("probs");
    auto *mutablePooling3d = pooling3dLayer->mutable_pooling3d();

    // Add Kernel sizes
    mutablePooling3d->set_kerneldepth(2);
    mutablePooling3d->set_kernelheight(2);
    mutablePooling3d->set_kernelwidth(2);

    // Add Strides
    mutablePooling3d->set_stridedepth(5);
    mutablePooling3d->set_strideheight(5);
    mutablePooling3d->set_stridewidth(5);

    // Add 6 Custom Paddings
    mutablePooling3d->set_paddingtype(CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM);
    mutablePooling3d->set_custompaddingfront(7);
    mutablePooling3d->set_custompaddingback(7);
    mutablePooling3d->set_custompaddingtop(7);
    mutablePooling3d->set_custompaddingbottom(7);
    mutablePooling3d->set_custompaddingleft(7);
    mutablePooling3d->set_custompaddingright(7);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}